

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O0

void pg::freeze_thaw_reset_rec_CALL
               (WorkerP *w,Task *__dq_head,FPISolver *arg_1,int arg_2,int arg_3,int arg_4)

{
  int iVar1;
  int arg_4_local;
  int arg_3_local;
  int arg_2_local;
  FPISolver *arg_1_local;
  Task *__dq_head_local;
  WorkerP *w_local;
  int N_1;
  int N;
  
  if (arg_3 < 0x81) {
    FPISolver::freezeThawReset(arg_1,arg_2,arg_3,arg_4);
  }
  else if ((arg_2 & 0x7fU) == 0) {
    iVar1 = (arg_3 / 0x80) * 0x40;
    freeze_thaw_reset_rec_SPAWN
              (w,__dq_head,arg_1,arg_2 + iVar1,arg_3 + (arg_3 / 0x80) * -0x40,arg_4);
    freeze_thaw_reset_rec_CALL(w,__dq_head + 1,arg_1,arg_2,iVar1,arg_4);
    freeze_thaw_reset_rec_SYNC(w,__dq_head);
  }
  else {
    iVar1 = 0x80 - (arg_2 & 0x7fU);
    freeze_thaw_reset_rec_SPAWN(w,__dq_head,arg_1,arg_2 + iVar1,arg_3 - iVar1,arg_4);
    FPISolver::freezeThawReset(arg_1,arg_2,iVar1,arg_4);
    freeze_thaw_reset_rec_SYNC(w,__dq_head);
  }
  return;
}

Assistant:

VOID_TASK_4(freeze_thaw_reset_rec, FPISolver*, solver, int, i, int, n, int, p)
{
    if (n>128) {
        // because dynamic bitset is not thread safe, work in blocks of 64...
        if (i&127) {
            // start not yet aligned
            int N = 128 - (i&127);
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            solver->freezeThawReset(i, N, p);
            SYNC(freeze_thaw_reset_rec);
        } else {
            int N = (n/128)*64;
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            CALL(freeze_thaw_reset_rec, solver, i, N, p);
            SYNC(freeze_thaw_reset_rec);
        }
    } else {
        solver->freezeThawReset(i, n, p);
    }
}